

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.cpp
# Opt level: O2

double * numerary::Numerary::linear_regression(double *X,double *Y,int *n)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pdVar2 = (double *)operator_new__(0x10);
  uVar1 = *n;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar6 = 0.0;
  dVar5 = 0.0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar9 = X[uVar3];
    dVar6 = dVar6 + dVar9;
    dVar5 = dVar5 + Y[uVar3];
    dVar7 = dVar7 + dVar9 * Y[uVar3];
    dVar8 = dVar8 + dVar9 * dVar9;
  }
  dVar9 = (double)(int)uVar1;
  dVar7 = (dVar9 * dVar7 - dVar5 * dVar6) / (dVar8 * dVar9 - dVar6 * dVar6);
  *pdVar2 = dVar7;
  pdVar2[1] = (dVar5 - dVar7 * dVar6) / dVar9;
  return pdVar2;
}

Assistant:

double* Numerary::linear_regression(double *X, double *Y, const int& n) {
        int i;
        double E_X = 0, E_Y = 0, E_XY = 0, E_X2 = 0, *ab = new double[2];

        for (i = 0; i < n; i++) {
            E_X     += X[i]; // Mathematical Expectation of X
            E_X2    += (X[i]*X[i]); // Mathematical Expectation of X^2
            E_Y     += Y[i]; // Mathematical Expectation of Y
            E_XY    += (X[i]*Y[i]); // Mathematical Expectation of X*Y
        }

        // Calculating coefficients of line (y = a*x + b)
        ab[0] = (n*E_XY - E_X*E_Y) / (n*E_X2 - E_X*E_X); // a
        ab[1] = (E_Y - ab[0]*E_X) / ((double) n); // b
        
        return ab;
    }